

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O2

void number_suite::array_int(void)

{
  bool bVar1;
  undefined4 local_164;
  view_type local_160;
  chunk_reader reader;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&reader.super_basic_reader<char>);
  local_160._M_len = 1;
  local_160._M_str = "[";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&reader.super_basic_reader<char>,&local_160);
  boost::detail::test_impl
            ("reader.next(\"[\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x62,"void number_suite::array_int()",bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,99,"void number_suite::array_int()",&local_160,&local_164);
  local_160._M_len = 1;
  local_160._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,100,"void number_suite::array_int()",!bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x65,"void number_suite::array_int()",&local_160,&local_164);
  local_160._M_len = 2;
  local_160._M_str = "0]";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_160);
  boost::detail::test_impl
            ("reader.next(\"0]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x66,"void number_suite::array_int()",bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x67,"void number_suite::array_int()",&local_160,&local_164);
  local_160._M_len = 1;
  local_160._M_str = "]";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_160);
  boost::detail::test_impl
            ("reader.next(\"]\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x68,"void number_suite::array_int()",bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x69,"void number_suite::array_int()",&local_160,&local_164);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.super_basic_reader<char>.stack);
  return;
}

Assistant:

void array_int()
{
    // "[0]"
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(reader.next("["));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST(!reader.next("0")); // Single zero is legal, but defer until next input
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.next("0]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST(reader.next("]"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}